

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::
ASTVisitor<no_implicit_port_name_in_port_connection::MainVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::ParameterSymbol>
          (ASTVisitor<no_implicit_port_name_in_port_connection::MainVisitor,_true,_true,_false,_false>
           *this,ParameterSymbol *t)

{
  Expression *this_00;
  
  this_00 = DeclaredType::getInitializer(&(t->super_ValueSymbol).declaredType);
  if (this_00 != (Expression *)0x0) {
    Expression::visit<no_implicit_port_name_in_port_connection::MainVisitor&>
              (this_00,(AlwaysFFVisitor *)this);
    return;
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }